

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O1

cl_int clGetMemAllocInfoINTEL_EMU
                 (cl_context context,void *ptr,cl_mem_info_intel param_name,size_t param_value_size,
                 void *param_value,size_t *param_value_size_ret)

{
  cl_int cVar1;
  
  if ((g_pIntercept != (CLIntercept *)0x0) &&
     ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory == true)) {
    cVar1 = CLIntercept::emulatedGetMemAllocInfoINTEL
                      (g_pIntercept,context,ptr,param_name,param_value_size,param_value,
                       param_value_size_ret);
    return cVar1;
  }
  return -0x3b;
}

Assistant:

cl_int CL_API_CALL clGetMemAllocInfoINTEL_EMU(
    cl_context context,
    const void* ptr,
    cl_mem_info_intel param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedGetMemAllocInfoINTEL(
            context,
            ptr,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret );
    }

    return CL_INVALID_OPERATION;
}